

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GetEnumValUse_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,EnumVal *enum_val)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((this->opts_).super_IDLOptions.scoped_enums == true) {
    EscapeKeyword(&local_40,this,(string *)enum_def);
    std::operator+(&local_60,&local_40,"::");
    EscapeKeyword(&local_80,this,&enum_val->name);
    std::operator+(__return_storage_ptr__,&local_60,&local_80);
  }
  else {
    if ((this->opts_).super_IDLOptions.prefixed_enums != true) {
      EscapeKeyword(__return_storage_ptr__,this,&enum_val->name);
      return __return_storage_ptr__;
    }
    EscapeKeyword(&local_40,this,(string *)enum_def);
    std::operator+(&local_60,&local_40,"_");
    EscapeKeyword(&local_80,this,&enum_val->name);
    std::operator+(__return_storage_ptr__,&local_60,&local_80);
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumValUse(const EnumDef &enum_def,
                            const EnumVal &enum_val) const {
    if (opts_.scoped_enums) {
      return Name(enum_def) + "::" + Name(enum_val);
    } else if (opts_.prefixed_enums) {
      return Name(enum_def) + "_" + Name(enum_val);
    } else {
      return Name(enum_val);
    }
  }